

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StlIterators.h
# Opt level: O2

pointer_based_stl_iterator<const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *
std::
__is_sorted_until<Eigen::internal::pointer_based_stl_iterator<Eigen::Matrix<double,4,1,0,4,1>const>,__gnu_cxx::__ops::_Iter_less_iter>
          (pointer_based_stl_iterator<const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
           *__return_storage_ptr__,
          pointer_based_stl_iterator<const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *param_2)

{
  pointer_based_stl_iterator<const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *ppVar1;
  pointer *ppdVar2;
  pointer *ppdVar3;
  pointer_based_stl_iterator<const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *ppVar4;
  pointer_based_stl_iterator<const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *ppVar5;
  
  if (__return_storage_ptr__ == param_2) {
    return param_2;
  }
  ppVar5 = (pointer_based_stl_iterator<const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
           &__return_storage_ptr__->field_0x8;
  do {
    ppVar4 = ppVar5;
    if (ppVar5 == param_2) {
      return ppVar4;
    }
    ppVar1 = ppVar5 + -1;
    ppdVar2 = &ppVar5->m_ptr;
    ppdVar3 = &ppVar5->m_ptr;
    ppVar5 = (pointer_based_stl_iterator<const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
             &ppVar5->field_0x8;
  } while (*(double *)&ppVar1->field_0x8 < (double)*ppdVar3 ||
           *(double *)&ppVar1->field_0x8 == (double)*ppdVar2);
  return ppVar4;
}

Assistant:

bool operator!=(const pointer_based_stl_iterator& other) const { return m_ptr != other.m_ptr; }